

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O3

bool __thiscall bssl::cbb_add_hex_consttime(bssl *this,CBB *cbb,Span<const_unsigned_char> in)

{
  byte bVar1;
  uint8_t uVar2;
  int iVar3;
  uchar *puVar4;
  uchar *puVar5;
  uint8_t *out;
  uint8_t *local_30;
  
  puVar4 = in.data_;
  iVar3 = CBB_add_space((CBB *)this,&local_30,(long)puVar4 * 2);
  if ((iVar3 != 0) && (puVar4 != (uchar *)0x0)) {
    puVar5 = (uchar *)0x0;
    do {
      bVar1 = puVar5[(long)&cbb->child];
      uVar2 = hex_char_consttime(bVar1 >> 4);
      *local_30 = uVar2;
      local_30 = local_30 + 1;
      uVar2 = hex_char_consttime(bVar1 & 0xf);
      *local_30 = uVar2;
      puVar5 = puVar5 + 1;
      local_30 = local_30 + 1;
    } while (puVar4 != puVar5);
  }
  return iVar3 != 0;
}

Assistant:

static bool cbb_add_hex_consttime(CBB *cbb, Span<const uint8_t> in) {
  uint8_t *out;
  if (!CBB_add_space(cbb, &out, in.size() * 2)) {
    return false;
  }

  for (uint8_t b : in) {
    *(out++) = hex_char_consttime(b >> 4);
    *(out++) = hex_char_consttime(b & 0xf);
  }

  return true;
}